

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Base.hpp
# Opt level: O1

void __thiscall
njoy::ENDFtk::record::
Base<njoy::ENDFtk::record::Real,njoy::ENDFtk::record::Real,njoy::ENDFtk::record::Integer<11>,njoy::ENDFtk::record::Integer<11>,njoy::ENDFtk::record::Integer<11>,njoy::ENDFtk::record::Integer<11>>
::Base<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (Base<njoy::ENDFtk::record::Real,njoy::ENDFtk::record::Real,njoy::ENDFtk::record::Integer<11>,njoy::ENDFtk::record::Integer<11>,njoy::ENDFtk::record::Integer<11>,njoy::ENDFtk::record::Integer<11>>
           *this,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *it,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *end)

{
  double dVar1;
  FieldTuple *result;
  
  *(undefined8 *)(this + 0x20) = 0;
  *(undefined8 *)(this + 0x28) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  dVar1 = tools::disco::Real<11u>::
          read<double,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(it,end);
  *(double *)(this + 0x28) = dVar1;
  tools::disco::
  Record<njoy::tools::disco::ENDF,njoy::tools::disco::Integer<11u>,njoy::tools::disco::Integer<11u>,njoy::tools::disco::Integer<11u>,njoy::tools::disco::Integer<11u>,njoy::tools::disco::RetainCarriage>
  ::read<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,double,long,long,long,long>
            (it,end,(double *)(this + 0x20),(long *)(this + 0x18),(long *)(this + 0x10),
             (long *)(this + 8),(long *)this);
  return;
}

Assistant:

Base( Iterator& it, const Iterator& end )
      try :
        fields( readFields< nFields - 1 >( it, end, std::true_type() ) )
    {
    } catch( std::exception& e ){
      Log::info( "Encountered error when reading Base of Record" );
      Log::info( "what(): {}", e.what() );
      throw e;
    }